

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayLen(FunctionValidator *this,ArrayLen *curr)

{
  bool result;
  Module *pMVar1;
  HeapType local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ArrayLen *local_18;
  ArrayLen *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayLen *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasGC(&pMVar1->features);
  shouldBeTrue<wasm::ArrayLen*>(this,result,local_18,"array.len requires gc [--enable-gc]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.type
                .id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayLen*,wasm::Type>
            (this,local_20,local_28,local_18,"array.len result must be an i32");
  local_30.id = (local_18->ref->type).id;
  HeapType::HeapType(&local_40,array);
  wasm::Type::Type(&local_38,local_40,Nullable);
  shouldBeSubType(this,local_30,local_38,(Expression *)local_18,
                  "array.len argument must be an array reference");
  return;
}

Assistant:

void FunctionValidator::visitArrayLen(ArrayLen* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.len requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "array.len result must be an i32");
  shouldBeSubType(curr->ref->type,
                  Type(HeapType::array, Nullable),
                  curr,
                  "array.len argument must be an array reference");
}